

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetter
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  DictionaryPropertyDescriptor<unsigned_short> *this_00;
  PropertyAttributes PVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
  *pSVar2;
  code *pcVar3;
  bool bVar4;
  unsigned_short uVar5;
  charcount_t cVar6;
  uint uVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  Var pvVar10;
  DescriptorFlags DVar11;
  undefined1 local_50 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = setterValue;
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  bVar4 = PropertyRecord::IsPropertyNameNumeric(pcVar8,cVar6);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ba,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_50);
  local_50 = (undefined1  [8])pcVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_50);
  this_01 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar6;
  uVar7 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,(CharacterBuffer<char16_t> *)local_50);
  DVar11 = None;
  if (-1 < (int)uVar7) {
    pSVar2 = (this_01->entries).ptr;
    DVar11 = None;
    if ((pSVar2[uVar7].
         super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .
         super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
         .
         super_ValueEntry<Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>_>
         .
         super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
         .value.Attributes & 8) == 0) {
      this_00 = (DictionaryPropertyDescriptor<unsigned_short> *)(pSVar2 + uVar7);
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(this_00);
      if (uVar5 == 0xffff) {
        uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_00);
        if (uVar5 != 0xffff) {
          uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_00);
          pvVar10 = DynamicObject::GetSlot(instance,(uint)uVar5);
          *(Var *)propertyName._8_8_ = pvVar10;
          uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_00);
          DVar11 = Accessor;
          if (info != (PropertyValueInfo *)0x0) {
            PVar1 = this_00->Attributes;
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = uVar5;
            info->m_attributes = PVar1;
            info->flags = InlineCacheSetterFlag;
          }
        }
      }
      else {
        DVar11 = WritableData;
        if ((this_00->Attributes & 4) == 0) {
          DVar11 = (uint)(this_00->Attributes >> 7) * 8 + Data;
        }
      }
    }
  }
  return DVar11;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        DictionaryPropertyDescriptor<T>* descriptor;

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetSetterFromDescriptor<false>(instance, descriptor, setterValue, info);
        }

        return None;
    }